

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O2

int hostkey_method_ssh_ed25519_sig_verify
              (LIBSSH2_SESSION *session,uchar *sig,size_t sig_len,uchar *m,size_t m_len,
              void **abstract)

{
  int iVar1;
  
  if (sig_len == 0x53) {
    iVar1 = _libssh2_ed25519_verify((EVP_PKEY *)*abstract,sig + 0x13,0x40,m,m_len);
    return iVar1;
  }
  return -1;
}

Assistant:

static int
hostkey_method_ssh_ed25519_sig_verify(LIBSSH2_SESSION * session,
                                      const unsigned char *sig,
                                      size_t sig_len,
                                      const unsigned char *m,
                                      size_t m_len, void **abstract)
{
    libssh2_ed25519_ctx *ctx = (libssh2_ed25519_ctx *) (*abstract);
    (void)session;

    if(sig_len < 19)
        return -1;

    /* Skip past keyname_len(4) + keyname(11){"ssh-ed25519"} +
       signature_len(4) */
    sig += 19;
    sig_len -= 19;

    if(sig_len != LIBSSH2_ED25519_SIG_LEN)
        return -1;

    return _libssh2_ed25519_verify(ctx, sig, sig_len, m, m_len);
}